

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::texParameteri
          (ReferenceContext *this,deUint32 target,deUint32 pname,int value)

{
  WrapMode WVar1;
  FilterMode FVar2;
  deBool dVar3;
  reference pvVar4;
  Sampler *pSVar5;
  TextureCube *local_80;
  TextureCube *local_78;
  TextureCube *local_70;
  TextureCube *local_68;
  TextureCube *local_60;
  TextureCube *local_58;
  FilterMode magMode;
  FilterMode minMode;
  WrapMode wrapR;
  WrapMode wrapT;
  WrapMode wrapS;
  Texture *texture;
  TextureUnit *unit;
  int value_local;
  deUint32 pname_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  pvVar4 = std::
           vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ::operator[](&this->m_textureUnits,(long)this->m_activeTexture);
  if (target == 0xde0) {
    if (pvVar4->tex1DBinding == (Texture1D *)0x0) {
      local_58 = (TextureCube *)&pvVar4->default1DTex;
    }
    else {
      local_58 = (TextureCube *)pvVar4->tex1DBinding;
    }
    _wrapT = local_58;
  }
  else if (target == 0xde1) {
    if (pvVar4->tex2DBinding == (Texture2D *)0x0) {
      local_60 = (TextureCube *)&pvVar4->default2DTex;
    }
    else {
      local_60 = (TextureCube *)pvVar4->tex2DBinding;
    }
    _wrapT = local_60;
  }
  else if (target == 0x806f) {
    if (pvVar4->tex3DBinding == (Texture3D *)0x0) {
      local_78 = (TextureCube *)&pvVar4->default3DTex;
    }
    else {
      local_78 = (TextureCube *)pvVar4->tex3DBinding;
    }
    _wrapT = local_78;
  }
  else if (target == 0x8513) {
    if (pvVar4->texCubeBinding == (TextureCube *)0x0) {
      local_68 = &pvVar4->defaultCubeTex;
    }
    else {
      local_68 = pvVar4->texCubeBinding;
    }
    _wrapT = local_68;
  }
  else if (target == 0x8c1a) {
    if (pvVar4->tex2DArrayBinding == (Texture2DArray *)0x0) {
      local_70 = (TextureCube *)&pvVar4->default2DArrayTex;
    }
    else {
      local_70 = (TextureCube *)pvVar4->tex2DArrayBinding;
    }
    _wrapT = local_70;
  }
  else {
    if (target != 0x9009) {
      setError(this,0x500);
      return;
    }
    if (pvVar4->texCubeArrayBinding == (TextureCubeArray *)0x0) {
      local_80 = (TextureCube *)&pvVar4->defaultCubeArrayTex;
    }
    else {
      local_80 = (TextureCube *)pvVar4->texCubeArrayBinding;
    }
    _wrapT = local_80;
  }
  if (pname == 0x2800) {
    FVar2 = mapGLFilterMode(value);
    do {
      if ((FVar2 != LINEAR) && (FVar2 != NEAREST)) {
        setError(this,0x501);
        return;
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    pSVar5 = rc::Texture::getSampler(&_wrapT->super_Texture);
    pSVar5->magFilter = FVar2;
  }
  else if (pname == 0x2801) {
    FVar2 = mapGLFilterMode(value);
    do {
      if (FVar2 == FILTERMODE_LAST) {
        setError(this,0x501);
        return;
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    pSVar5 = rc::Texture::getSampler(&_wrapT->super_Texture);
    pSVar5->minFilter = FVar2;
  }
  else if (pname == 0x2802) {
    WVar1 = mapGLWrapMode(value);
    do {
      if (WVar1 == WRAPMODE_LAST) {
        setError(this,0x501);
        return;
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    pSVar5 = rc::Texture::getSampler(&_wrapT->super_Texture);
    pSVar5->wrapS = WVar1;
  }
  else if (pname == 0x2803) {
    WVar1 = mapGLWrapMode(value);
    do {
      if (WVar1 == WRAPMODE_LAST) {
        setError(this,0x501);
        return;
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    pSVar5 = rc::Texture::getSampler(&_wrapT->super_Texture);
    pSVar5->wrapT = WVar1;
  }
  else if (pname == 0x8072) {
    WVar1 = mapGLWrapMode(value);
    do {
      if (WVar1 == WRAPMODE_LAST) {
        setError(this,0x501);
        return;
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    pSVar5 = rc::Texture::getSampler(&_wrapT->super_Texture);
    pSVar5->wrapR = WVar1;
  }
  else if (pname == 0x813d) {
    do {
      if (value < 0) {
        setError(this,0x501);
        return;
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    rc::Texture::setMaxLevel(&_wrapT->super_Texture,value);
  }
  else {
    setError(this,0x500);
  }
  return;
}

Assistant:

void ReferenceContext::texParameteri (deUint32 target, deUint32 pname, int value)
{
	TextureUnit&	unit		= m_textureUnits[m_activeTexture];
	Texture*		texture		= DE_NULL;

	switch (target)
	{
		case GL_TEXTURE_1D:				texture = unit.tex1DBinding			? unit.tex1DBinding			: &unit.default1DTex;			break;
		case GL_TEXTURE_2D:				texture = unit.tex2DBinding			? unit.tex2DBinding			: &unit.default2DTex;			break;
		case GL_TEXTURE_CUBE_MAP:		texture = unit.texCubeBinding		? unit.texCubeBinding		: &unit.defaultCubeTex;			break;
		case GL_TEXTURE_2D_ARRAY:		texture = unit.tex2DArrayBinding	? unit.tex2DArrayBinding	: &unit.default2DArrayTex;		break;
		case GL_TEXTURE_3D:				texture = unit.tex3DBinding			? unit.tex3DBinding			: &unit.default3DTex;			break;
		case GL_TEXTURE_CUBE_MAP_ARRAY:	texture = unit.texCubeArrayBinding	? unit.texCubeArrayBinding	: &unit.defaultCubeArrayTex;	break;

		default:					RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
	}

	switch (pname)
	{
		case GL_TEXTURE_WRAP_S:
		{
			tcu::Sampler::WrapMode wrapS = mapGLWrapMode(value);
			RC_IF_ERROR(wrapS == tcu::Sampler::WRAPMODE_LAST, GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().wrapS = wrapS;
			break;
		}

		case GL_TEXTURE_WRAP_T:
		{
			tcu::Sampler::WrapMode wrapT = mapGLWrapMode(value);
			RC_IF_ERROR(wrapT == tcu::Sampler::WRAPMODE_LAST, GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().wrapT = wrapT;
			break;
		}

		case GL_TEXTURE_WRAP_R:
		{
			tcu::Sampler::WrapMode wrapR = mapGLWrapMode(value);
			RC_IF_ERROR(wrapR == tcu::Sampler::WRAPMODE_LAST, GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().wrapR = wrapR;
			break;
		}

		case GL_TEXTURE_MIN_FILTER:
		{
			tcu::Sampler::FilterMode minMode = mapGLFilterMode(value);
			RC_IF_ERROR(minMode == tcu::Sampler::FILTERMODE_LAST, GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().minFilter = minMode;
			break;
		}

		case GL_TEXTURE_MAG_FILTER:
		{
			tcu::Sampler::FilterMode magMode = mapGLFilterMode(value);
			RC_IF_ERROR(magMode != tcu::Sampler::LINEAR && magMode != tcu::Sampler::NEAREST,
						GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().magFilter = magMode;
			break;
		}

		case GL_TEXTURE_MAX_LEVEL:
		{
			RC_IF_ERROR(value < 0, GL_INVALID_VALUE, RC_RET_VOID);
			texture->setMaxLevel(value);
			break;
		}

		default:
			RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
	}
}